

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

sunrealtype N_VL1Norm_SensWrapper(N_Vector x)

{
  int i;
  long lVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  
  sVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    sVar3 = N_VL1Norm(*(N_Vector *)(*x->content + lVar1 * 8));
    if (sVar3 <= sVar2) {
      sVar3 = sVar2;
    }
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

sunrealtype N_VL1Norm_SensWrapper(N_Vector x)
{
  int i;
  sunrealtype nrm, tmp;

  nrm = ZERO;

  for (i = 0; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VL1Norm(NV_VEC_SW(x, i));
    if (tmp > nrm) { nrm = tmp; }
  }

  return (nrm);
}